

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

bool __thiscall AgenPeeps::AgenDependentInstrs(AgenPeeps *this,Instr *instr1,Instr *instr2)

{
  bool bVar1;
  IndirOpnd *pIVar2;
  IndirOpnd *pIVar3;
  IndirOpnd *pIVar4;
  RegOpnd *this_00;
  RegOpnd *opnd;
  RegOpnd *opnd_00;
  
  bVar1 = LowererMD::IsAssign(instr1);
  if (((bVar1) && (bVar1 = DependentInstrs(this,instr1,instr2), bVar1)) &&
     (bVar1 = IR::Opnd::IsRegOpnd(instr1->m_dst), bVar1)) {
    if ((instr2->m_src1 == (Opnd *)0x0) || (bVar1 = IR::Opnd::IsIndirOpnd(instr2->m_src1), !bVar1))
    {
      pIVar2 = (IndirOpnd *)0x0;
    }
    else {
      pIVar2 = IR::Opnd::AsIndirOpnd(instr2->m_src1);
    }
    if ((instr2->m_src2 == (Opnd *)0x0) || (bVar1 = IR::Opnd::IsIndirOpnd(instr2->m_src2), !bVar1))
    {
      pIVar3 = (IndirOpnd *)0x0;
    }
    else {
      pIVar3 = IR::Opnd::AsIndirOpnd(instr2->m_src2);
    }
    if ((instr2->m_dst == (Opnd *)0x0) || (bVar1 = IR::Opnd::IsIndirOpnd(instr2->m_dst), !bVar1)) {
      pIVar4 = (IndirOpnd *)0x0;
    }
    else {
      pIVar4 = IR::Opnd::AsIndirOpnd(instr2->m_dst);
    }
    this_00 = IR::Opnd::AsRegOpnd(instr1->m_dst);
    if (pIVar2 == (IndirOpnd *)0x0) {
      if (pIVar3 == (IndirOpnd *)0x0) {
        if (pIVar4 == (IndirOpnd *)0x0) {
          return false;
        }
        opnd = pIVar4->m_baseOpnd;
        opnd_00 = pIVar4->m_indexOpnd;
      }
      else {
        opnd = pIVar3->m_baseOpnd;
        opnd_00 = pIVar3->m_indexOpnd;
      }
    }
    else {
      opnd = pIVar2->m_baseOpnd;
      opnd_00 = pIVar2->m_indexOpnd;
    }
    if ((opnd != (RegOpnd *)0x0) &&
       (bVar1 = IR::RegOpnd::IsSameRegUntyped(this_00,&opnd->super_Opnd), bVar1)) {
      return true;
    }
    if (opnd_00 != (RegOpnd *)0x0) {
      bVar1 = IR::RegOpnd::IsSameRegUntyped(this_00,&opnd_00->super_Opnd);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool AgenPeeps::AgenDependentInstrs(IR::Instr *instr1, IR::Instr *instr2)
{
    // We only deal with assign instructions for now.
    if (!LowererMD::IsAssign(instr1) || !DependentInstrs(instr1, instr2))
        return false;

    if (instr1->GetDst()->IsRegOpnd())
    {
        IR::IndirOpnd *src1 = (instr2->GetSrc1() && instr2->GetSrc1()->IsIndirOpnd()) ? instr2->GetSrc1()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *src2 = (instr2->GetSrc2() && instr2->GetSrc2()->IsIndirOpnd()) ? instr2->GetSrc2()->AsIndirOpnd() : nullptr;
        IR::IndirOpnd *dst  = (instr2->GetDst()  && instr2->GetDst()->IsIndirOpnd())  ? instr2->GetDst()->AsIndirOpnd() : nullptr;
        IR::RegOpnd   *regOpnd = instr1->GetDst()->AsRegOpnd();

        IR::RegOpnd *base, *index;
        if (src1)
        {
            base = src1->GetBaseOpnd();
            index = src1->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (src2)
        {
            base = src2->GetBaseOpnd();
            index = src2->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }

        if (dst)
        {
            base = dst->GetBaseOpnd();
            index = dst->GetIndexOpnd();
            return (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index));
        }
    }
    return false;
}